

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

void __thiscall chrono::ChOptimizer::Eval_grad(ChOptimizer *this,double *x,double *gr)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  ChVectorDynamic<> Vin;
  ChVectorDynamic<> Vout;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_58;
  double local_40;
  double local_38;
  
  if (this->afunctionGrad == (ChFx *)0x0) {
    uVar1 = (*this->_vptr_ChOptimizer[7])(this);
    local_40 = Eval_fx(this,x);
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        local_38 = x[uVar3];
        x[uVar3] = local_38 + this->grad_step;
        dVar4 = Eval_fx(this,x);
        gr[uVar3] = (dVar4 - local_40) / this->grad_step;
        x[uVar3] = local_38;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    goto LAB_007cb41f;
  }
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_68,(long)this->C_vars);
  local_58.m_storage.m_data = (double *)0x0;
  local_58.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_58,(long)this->C_vars);
  if (0 < local_68.m_storage.m_rows) {
    lVar2 = 0;
    do {
      local_68.m_storage.m_data[lVar2] = x[lVar2];
      lVar2 = lVar2 + 1;
    } while (local_68.m_storage.m_rows != lVar2);
  }
  (*(code *)**(undefined8 **)this->afunctionGrad)(this->afunctionGrad,&local_58,&local_68);
  if (local_58.m_storage.m_rows < 1) {
    if (local_58.m_storage.m_data != (double *)0x0) goto LAB_007cb404;
  }
  else {
    lVar2 = 0;
    do {
      gr[lVar2] = local_58.m_storage.m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (local_58.m_storage.m_rows != lVar2);
LAB_007cb404:
    free((void *)local_58.m_storage.m_data[-1]);
  }
  if (local_68.m_storage.m_data != (double *)0x0) {
    free((void *)local_68.m_storage.m_data[-1]);
  }
LAB_007cb41f:
  this->grad_evaluations = this->grad_evaluations + 1;
  return;
}

Assistant:

void ChOptimizer::Eval_grad(double x[], double gr[]) {
    if (afunctionGrad) {
        ChVectorDynamic<> Vin(C_vars);
        ChVectorDynamic<> Vout(C_vars);

        for (int i = 0; i < Vin.size(); i++)
            Vin(i) = x[i];
        afunctionGrad->Eval(Vout, Vin);
        for (int i = 0; i < Vout.size(); i++)
            gr[i] = Vout(i);
    } else {
        // otherwise use BDF
        int mtotvars = GetNumOfVars();
        double oldval;
        double mf, mfd;

        // Evaluate central value of function
        mf = Eval_fx(x);

        for (int mvar = 0; mvar < mtotvars; mvar++) {
            oldval = x[mvar];
            // increment one variable
            x[mvar] = oldval + grad_step;
            mfd = Eval_fx(x);
            // compute gradient by BDF
            gr[mvar] = ((mfd - mf) / (grad_step));
            // back to original value
            x[mvar] = oldval;
        }
    }
    grad_evaluations++;  // increment the counter of total number of gradient evaluations
}